

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O0

char * bson_iter_code(bson_iter_t *iter,uint32_t *length)

{
  uint32_t uVar1;
  uint32_t *length_local;
  bson_iter_t *iter_local;
  
  if (iter == (bson_iter_t *)0x0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson-iter.c"
            ,0x54c,"bson_iter_code","iter");
    abort();
  }
  if (iter->raw[iter->type] == '\r') {
    if (length != (uint32_t *)0x0) {
      uVar1 = bson_iter_utf8_len_unsafe(iter);
      *length = uVar1;
    }
    iter_local = (bson_iter_t *)(iter->raw + iter->d2);
  }
  else {
    if (length != (uint32_t *)0x0) {
      *length = 0;
    }
    iter_local = (bson_iter_t *)0x0;
  }
  return (char *)iter_local;
}

Assistant:

const char *
bson_iter_code (const bson_iter_t *iter, /* IN */
                uint32_t *length)        /* OUT */
{
   BSON_ASSERT (iter);

   if (ITER_TYPE (iter) == BSON_TYPE_CODE) {
      if (length) {
         *length = bson_iter_utf8_len_unsafe (iter);
      }

      return (const char *) (iter->raw + iter->d2);
   }

   if (length) {
      *length = 0;
   }

   return NULL;
}